

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this,
          WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  unsigned_short propertyIndex;
  int iVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  WriteBarrierPtr<const_Js::PropertyRecord> local_48;
  WriteBarrierPtr<const_Js::PropertyRecord> *local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_38 = (undefined4)CONCAT71(in_register_00000011,attributes);
  iVar3 = *(int *)(this + 0xc);
  local_40 = propertyKey;
  if (0xfffe < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar2) goto LAB_00c8f833;
    *puVar4 = 0;
    iVar3 = *(int *)(this + 0xc);
  }
  local_34 = (undefined4)CONCAT71(in_register_00000081,isFixed);
  if (iVar3 <= (int)(uint)*(ushort *)(this + 0x2a)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar2) {
LAB_00c8f833:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  propertyIndex = ::Math::PostInc<unsigned_short>((unsigned_short *)(this + 0x2a));
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&local_48,local_40);
  Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
            (this,propertyIndex,&local_48,(PropertyAttributes)local_38,isInitialized,local_34._0_1_,
             usedAsFixed,scriptContext);
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }